

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O0

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,bool isExplicit)

{
  code *pcVar1;
  Value *constantBounds_00;
  bool bVar2;
  ValueNumber VVar3;
  ValueNumber VVar4;
  int32 iVar5;
  undefined4 *puVar6;
  IntBounds *pIVar7;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar8;
  IntBoundedValueInfo *pIVar9;
  int *piVar10;
  GlobOpt *local_b0;
  int32 local_70;
  int32 local_6c;
  int local_68;
  int32 local_64;
  int32 newMax;
  int local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_56;
  int32 newMin;
  IntBounds *pIStack_50;
  ValueNumber valueNumber;
  IntBounds *bounds;
  ValueInfo *valueInfo;
  IntConstantBounds *pIStack_38;
  bool isExplicit_local;
  IntConstantBounds *boundConstantBounds_local;
  Value *boundValue_local;
  IntConstantBounds *constantBounds_local;
  Value *value_local;
  GlobOpt *this_local;
  
  valueInfo._7_1_ = isExplicit;
  pIStack_38 = boundConstantBounds;
  boundConstantBounds_local = (IntConstantBounds *)boundValue;
  boundValue_local = (Value *)constantBounds;
  constantBounds_local = (IntConstantBounds *)value;
  value_local = (Value *)this;
  if ((value == (Value *)0x0) && (bVar2 = IntConstantBounds::IsConstant(constantBounds), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x1a1,"(value || constantBounds.IsConstant())",
                       "value || constantBounds.IsConstant()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((boundConstantBounds_local == (IntConstantBounds *)0x0) &&
     (bVar2 = IntConstantBounds::IsConstant(pIStack_38), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x1a2,"(boundValue || boundConstantBounds.IsConstant())",
                       "boundValue || boundConstantBounds.IsConstant()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (constantBounds_local == (IntConstantBounds *)0x0) {
    this_local = (GlobOpt *)0x0;
  }
  else {
    if (boundConstantBounds_local != (IntConstantBounds *)0x0) {
      VVar3 = ::Value::GetValueNumber((Value *)constantBounds_local);
      VVar4 = ::Value::GetValueNumber((Value *)boundConstantBounds_local);
      if (VVar3 == VVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x1a7,
                           "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())"
                           ,"!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    pIVar7 = (IntBounds *)::Value::GetValueInfo((Value *)constantBounds_local);
    constantBounds_00 = boundValue_local;
    bounds = pIVar7;
    bVar2 = IntConstantBounds::IsConstant(pIStack_38);
    pIVar7 = GetIntBoundsToUpdate
                       (this,(ValueInfo *)pIVar7,(IntConstantBounds *)constantBounds_00,true,bVar2,
                        true,(bool)(valueInfo._7_1_ & 1));
    pIStack_50 = pIVar7;
    if (pIVar7 != (IntBounds *)0x0) {
      if (boundConstantBounds_local == (IntConstantBounds *)0x0) {
        iVar5 = IntConstantBounds::LowerBound(pIStack_38);
        IntBounds::SetLowerBound(pIVar7,iVar5);
        pIVar7 = pIStack_50;
        iVar5 = IntConstantBounds::LowerBound(pIStack_38);
        IntBounds::SetUpperBound(pIVar7,iVar5,(bool)(valueInfo._7_1_ & 1));
      }
      else {
        newMin = ::Value::GetValueNumber((Value *)constantBounds_local);
        IntBounds::SetLowerBound
                  (pIStack_50,newMin,(Value *)boundConstantBounds_local,(bool)(valueInfo._7_1_ & 1))
        ;
        IntBounds::SetUpperBound
                  (pIStack_50,newMin,(Value *)boundConstantBounds_local,(bool)(valueInfo._7_1_ & 1))
        ;
      }
      pIVar7 = pIStack_50;
      paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
               ValueInfo::Type((ValueInfo *)bounds);
      local_56.field_0 = *paVar8;
      bVar2 = IntBounds::RequiresIntBoundedValueInfo(pIVar7,(ValueType)local_56.field_0);
      if (bVar2) {
        pIVar9 = NewIntBoundedValueInfo(this,(ValueInfo *)bounds,pIStack_50);
        return &pIVar9->super_ValueInfo;
      }
      IntBounds::Delete(pIStack_50);
    }
    bVar2 = ValueType::IsInt((ValueType *)&bounds->wasConstantUpperBoundEstablishedExplicitly);
    if (bVar2) {
      newMax = IntConstantBounds::LowerBound((IntConstantBounds *)boundValue_local);
      local_64 = IntConstantBounds::LowerBound(pIStack_38);
      piVar10 = max<int>(&newMax,&local_64);
      local_5c = *piVar10;
      local_6c = IntConstantBounds::UpperBound((IntConstantBounds *)boundValue_local);
      local_70 = IntConstantBounds::UpperBound(pIStack_38);
      piVar10 = min<int>(&local_6c,&local_70);
      local_68 = *piVar10;
      if (local_68 < local_5c) {
        local_b0 = (GlobOpt *)0x0;
      }
      else {
        local_b0 = (GlobOpt *)NewIntRangeValueInfo(this,(ValueInfo *)bounds,local_5c,local_68);
      }
      this_local = local_b0;
    }
    else {
      this_local = (GlobOpt *)0x0;
    }
  }
  return (ValueInfo *)this_local;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(valueInfo, constantBounds, true, boundConstantBounds.IsConstant(), true, isExplicit);
    if(bounds)
    {
        if(boundValue)
        {
            const ValueNumber valueNumber = value->GetValueNumber();
            bounds->SetLowerBound(valueNumber, boundValue, isExplicit);
            bounds->SetUpperBound(valueNumber, boundValue, isExplicit);
        }
        else
        {
            bounds->SetLowerBound(boundConstantBounds.LowerBound());
            bounds->SetUpperBound(boundConstantBounds.LowerBound(), isExplicit);
        }
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return NewIntBoundedValueInfo(valueInfo, bounds);
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt())
    {
        return nullptr;
    }

    const int32 newMin = max(constantBounds.LowerBound(), boundConstantBounds.LowerBound());
    const int32 newMax = min(constantBounds.UpperBound(), boundConstantBounds.UpperBound());
    return newMin <= newMax ? NewIntRangeValueInfo(valueInfo, newMin, newMax) : nullptr;
}